

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

CURLcode Curl_resolv_check(Curl_easy *data,Curl_dns_entry **dns)

{
  Curl_dns_entry **dns_local;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->conn->bits).field_0x4 >> 0x1b & 1) == 0) {
    data_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    data_local._4_4_ = Curl_doh_is_resolved(data,dns);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_resolv_check(struct Curl_easy *data,
                           struct Curl_dns_entry **dns)
{
#if defined(CURL_DISABLE_DOH) && !defined(CURLRES_ASYNCH)
  (void)data;
  (void)dns;
#endif
#ifndef CURL_DISABLE_DOH
  if(data->conn->bits.doh)
    return Curl_doh_is_resolved(data, dns);
#endif
  return Curl_resolver_is_resolved(data, dns);
}